

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O1

int __thiscall
event_track::ingest_event_stream::print_samples_from_file
          (ingest_event_stream *this,istream *infile,bool init_only)

{
  string *psVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  uint uVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  bool bVar10;
  pointer puVar11;
  int iVar12;
  uint32_t uVar13;
  ssize_t sVar14;
  ostream *poVar15;
  ulong uVar16;
  size_t in_RCX;
  ulong uVar17;
  undefined7 in_register_00000011;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  pointer pbVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  uint uVar22;
  undefined **ppuVar23;
  bool bVar24;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_data;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  EventMessageInstanceBox im_box;
  exception e;
  uint64_t local_660;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_648;
  ulong local_630;
  _func_int **local_628;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_620;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> local_618;
  long local_5f8;
  ulong local_5f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_5e8;
  uint8_t *local_5e0;
  string *local_5d8;
  uint32_t *local_5d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_5c8;
  uint8_t *local_5c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_5b8;
  uint8_t *local_5b0;
  string *local_5a8;
  uint32_t *local_5a0;
  string *local_598;
  uint32_t *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  pointer local_578;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_570;
  uint8_t *local_568;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_560;
  uint8_t *local_558;
  string *local_550;
  uint32_t *local_548;
  string *local_540;
  uint32_t *local_538;
  DASHEventMessageBoxv1 local_530;
  uchar *local_458 [2];
  uchar local_448 [16];
  uchar *local_438 [2];
  uchar local_428 [16];
  undefined1 local_418 [264];
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  uint8_t local_2f0 [8];
  uint8_t auStack_2e8 [8];
  undefined1 local_2e0 [24];
  undefined2 uStack_2c8;
  _func_int **local_2c0;
  undefined8 local_2b8;
  uint64_t uStack_2b0;
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  uint8_t local_288 [8];
  uint8_t auStack_280 [8];
  undefined1 local_278 [24];
  undefined2 uStack_260;
  undefined8 local_258 [3];
  mfhd local_240;
  tfhd local_1d0;
  tfdt local_140;
  trun local_c8;
  
  __buf = (void *)CONCAT71(in_register_00000011,init_only);
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) == 0) {
    local_618.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_618.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_618.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppuVar23 = &PTR_size_00128380;
    do {
      if (*(int *)(infile + *(long *)(*(long *)infile + -0x18) + 0x20) != 0) break;
      local_418._0_8_ = &PTR_size_00128380;
      local_418._8_4_ = 0;
      local_418._16_8_ = 0;
      local_418._24_8_ = local_418 + 0x28;
      local_418._32_8_ = 0;
      local_418[0x28] = '\0';
      local_418._88_2_ = 0;
      local_418._90_8_ = 0;
      local_418._72_8_ = (pointer)0x0;
      local_418._80_2_ = 0;
      local_418._82_6_ = 0;
      sVar14 = fmp4_stream::box::read((box *)local_418,(int)infile,__buf,in_RCX);
      if ((char)sVar14 == '\0') {
        bVar24 = false;
        __buf = extraout_RDX;
      }
      else {
        std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                  (&local_618,(value_type *)local_418);
        iVar12 = std::__cxx11::string::compare(local_418 + 0x18);
        bVar24 = iVar12 != 0;
        __buf = extraout_RDX_00;
      }
      local_418._0_8_ = &PTR_size_00128380;
      if ((pointer)local_418._72_8_ != (pointer)0x0) {
        operator_delete((void *)local_418._72_8_);
        __buf = extraout_RDX_01;
      }
      if ((undefined1 *)local_418._24_8_ != local_418 + 0x28) {
        operator_delete((void *)local_418._24_8_);
        __buf = extraout_RDX_02;
      }
    } while (bVar24);
    bVar24 = local_618.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
             _M_impl.super__Vector_impl_data._M_start ==
             local_618.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (!bVar24) {
      local_538 = &(this->super_ingest_stream).init_fragment_.ftyp_box_.size_;
      local_540 = (string *)&(this->super_ingest_stream).init_fragment_.ftyp_box_.box_type_;
      local_558 = (this->super_ingest_stream).init_fragment_.ftyp_box_.extended_type_;
      local_560 = &(this->super_ingest_stream).init_fragment_.ftyp_box_.box_data_;
      local_548 = &(this->super_ingest_stream).init_fragment_.moov_box_.size_;
      local_550 = (string *)&(this->super_ingest_stream).init_fragment_.moov_box_.box_type_;
      local_568 = (this->super_ingest_stream).init_fragment_.moov_box_.extended_type_;
      local_570 = &(this->super_ingest_stream).init_fragment_.moov_box_.box_data_;
      local_578 = local_418 + 0x90;
      local_580 = (undefined8 *)(local_418 + 0xb0);
      local_588 = local_258;
      paVar21 = &local_530.scheme_id_uri_.field_2;
      paVar18 = &local_530.value_.field_2;
      local_590 = &(this->super_ingest_stream).mfra_box_.size_;
      local_620 = &local_530.message_data_;
      local_598 = (string *)&(this->super_ingest_stream).mfra_box_.box_type_;
      local_5b0 = (this->super_ingest_stream).mfra_box_.extended_type_;
      local_5b8 = &(this->super_ingest_stream).mfra_box_.box_data_;
      local_5a0 = &(this->super_ingest_stream).sidx_box_.size_;
      local_5a8 = (string *)&(this->super_ingest_stream).sidx_box_.box_type_;
      local_5c0 = (this->super_ingest_stream).sidx_box_.extended_type_;
      local_5c8 = &(this->super_ingest_stream).sidx_box_.box_data_;
      local_5d0 = &(this->super_ingest_stream).meta_box_.size_;
      local_5d8 = (string *)&(this->super_ingest_stream).meta_box_.box_type_;
      local_5e0 = (this->super_ingest_stream).meta_box_.extended_type_;
      local_5e8 = &(this->super_ingest_stream).meta_box_.box_data_;
      local_628 = (_func_int **)&PTR_size_00128380;
      pbVar20 = local_618.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        psVar1 = &pbVar20->box_type_;
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar9 = *(undefined4 *)&pbVar20->field_0xc;
          uVar7 = pbVar20->large_size_;
          local_538[0] = pbVar20->size_;
          local_538[1] = uVar9;
          *(uint64_t *)(local_538 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_540);
          uVar8 = *(undefined8 *)(pbVar20->extended_type_ + 8);
          *(undefined8 *)local_558 = *(undefined8 *)pbVar20->extended_type_;
          *(undefined8 *)(local_558 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_560,&pbVar20->box_data_);
          bVar10 = pbVar20->has_uuid_;
          (this->super_ingest_stream).init_fragment_.ftyp_box_.is_large_ = pbVar20->is_large_;
          (this->super_ingest_stream).init_fragment_.ftyp_box_.has_uuid_ = bVar10;
        }
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar9 = *(undefined4 *)&pbVar20->field_0xc;
          uVar7 = pbVar20->large_size_;
          local_548[0] = pbVar20->size_;
          local_548[1] = uVar9;
          *(uint64_t *)(local_548 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_550);
          uVar8 = *(undefined8 *)(pbVar20->extended_type_ + 8);
          *(undefined8 *)local_568 = *(undefined8 *)pbVar20->extended_type_;
          *(undefined8 *)(local_568 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_570,&pbVar20->box_data_);
          bVar10 = pbVar20->has_uuid_;
          (this->super_ingest_stream).init_fragment_.moov_box_.is_large_ = pbVar20->is_large_;
          (this->super_ingest_stream).init_fragment_.moov_box_.has_uuid_ = bVar10;
          if (init_only) {
            std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_618);
            if (!bVar24) {
              return 0;
            }
            goto LAB_0010c412;
          }
        }
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          local_418._8_4_ = 0;
          local_418._16_8_ = 0;
          local_418._24_8_ = local_418 + 0x28;
          local_418._32_8_ = 0;
          local_418[0x28] = '\0';
          local_418._88_2_ = 0;
          local_418._90_8_ = 0;
          local_418._72_8_ = (pointer)0x0;
          local_418._80_2_ = 0;
          local_418._82_6_ = 0;
          local_418._112_4_ = 0;
          local_418._120_8_ = 0;
          local_418._128_8_ = local_578;
          local_418._136_8_ = 0;
          local_418[0x90] = '\0';
          *(undefined8 *)((long)local_580 + 10) = 0;
          *(undefined8 *)((long)local_580 + 0x12) = 0;
          *local_580 = 0;
          local_580[1] = 0;
          local_418[0xe0] = 0;
          local_418._225_8_ = 0;
          local_418._208_8_ = (pointer)0x0;
          local_418[0xd8] = 0;
          local_418._217_7_ = 0;
          local_418._248_8_ = (ulong)(uint)local_418._252_4_ << 0x20;
          local_418._256_8_ = 0;
          local_310._M_p = (pointer)&local_300;
          local_308 = 0;
          local_300._M_local_buf[0] = '\0';
          local_2e0._16_2_ = 0;
          stack0xfffffffffffffd32 = 0;
          local_2e0._0_8_ = (pointer)0x0;
          local_2e0._8_2_ = 0;
          local_2e0._10_6_ = 0;
          local_2b8 = (ulong)local_2b8._4_4_ << 0x20;
          uStack_2b0 = 0;
          local_2a8._M_p = (pointer)&local_298;
          local_2a0 = 0;
          local_298._M_local_buf[0] = '\0';
          local_278._16_2_ = 0;
          stack0xfffffffffffffd9a = 0;
          local_278._0_8_ = (pointer)0x0;
          local_278._8_2_ = 0;
          local_278._10_6_ = 0;
          *(undefined4 *)(local_588 + 2) = 0;
          *local_588 = 0;
          local_588[1] = 0;
          local_418._0_8_ = ppuVar23;
          local_418._104_8_ = ppuVar23;
          local_418._240_8_ = ppuVar23;
          local_2c0 = (_func_int **)ppuVar23;
          fmp4_stream::mfhd::mfhd(&local_240);
          fmp4_stream::tfhd::tfhd(&local_1d0);
          fmp4_stream::tfdt::tfdt(&local_140);
          fmp4_stream::trun::trun(&local_c8);
          local_418._248_4_ = pbVar20->size_;
          local_418._252_4_ = *(undefined4 *)&pbVar20->field_0xc;
          local_418._256_8_ = pbVar20->large_size_;
          std::__cxx11::string::_M_assign((string *)&local_310);
          local_2f0 = *(uint8_t (*) [8])pbVar20->extended_type_;
          auStack_2e8 = *(uint8_t (*) [8])(pbVar20->extended_type_ + 8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e0,
                     &pbVar20->box_data_);
          uVar8 = stack0xfffffffffffffd32;
          uVar2 = pbVar20->is_large_;
          uVar4 = pbVar20->has_uuid_;
          uStack_2c8._1_1_ = (bool)uVar4;
          uStack_2c8._0_1_ = (bool)uVar2;
          local_2e0._18_6_ = (undefined6)uVar8;
          fmp4_stream::media_fragment::parse_moof((media_fragment *)local_418);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"==  found movie fragment with base media decode time: ",
                     0x36);
          poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          if ((local_1d0.default_base_is_moof_ == true) &&
             (local_c8.data_offset_ - 8U == local_418._248_4_)) {
            iVar12 = std::__cxx11::string::compare((char *)&pbVar20[1].box_type_);
            if (iVar12 == 0) {
              local_2b8 = *(long *)&pbVar20[1].size_;
              uStack_2b0 = pbVar20[1].large_size_;
              std::__cxx11::string::_M_assign((string *)&local_2a8);
              local_288 = *(uint8_t (*) [8])pbVar20[1].extended_type_;
              auStack_280 = *(uint8_t (*) [8])(pbVar20[1].extended_type_ + 8);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,
                         &pbVar20[1].box_data_);
              uVar8 = stack0xfffffffffffffd9a;
              uVar3 = pbVar20[1].is_large_;
              uVar5 = pbVar20[1].has_uuid_;
              uStack_260._1_1_ = (bool)uVar5;
              uStack_260._0_1_ = (bool)uVar3;
              local_278._18_6_ = (undefined6)uVar8;
              if (((local_c8.sample_duration_present_ == true) &&
                  (local_c8.sample_size_present_ == true)) &&
                 (local_c8.m_sentry.
                  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_c8.m_sentry.
                  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
                uVar19 = 0;
                local_660 = local_140.base_media_decode_time_;
                local_630 = 0;
                do {
                  uVar6 = local_c8.m_sentry.
                          super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].sample_size_;
                  uVar16 = (ulong)uVar6;
                  local_5f0 = uVar19;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&local_648,uVar16,(allocator_type *)&local_530);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"== found sample, presentation time = ",0x25);
                  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15," duration = ",0xc);
                  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15," sample size = ",0xf);
                  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15," == ",4);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                  std::ostream::put((char)poVar15);
                  std::ostream::flush();
                  puVar11 = local_648.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  if (uVar16 != 0) {
                    uVar17 = 0;
                    do {
                      local_648.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar17] =
                           *(pointer)(local_278._0_8_ +
                                     (ulong)(uint)((int)local_630 + 8 + (int)uVar17));
                      uVar17 = uVar17 + 1;
                    } while (uVar16 != uVar17);
                  }
                  local_5f8 = uVar19 * 0x20;
                  if (uVar6 < 9) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"empty sample (embe/emeb): ",0x1a);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
                    std::ostream::put(-0x30);
                    std::ostream::flush();
                  }
                  else {
                    local_438[0] = local_428;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"emib","");
                    if (((puVar11[4] != *local_438[0]) || (puVar11[5] != local_438[0][1])) ||
                       ((puVar11[6] != local_438[0][2] ||
                        (bVar24 = true, puVar11[7] != local_438[0][3])))) {
                      bVar24 = false;
                    }
                    if (local_438[0] != local_428) {
                      operator_delete(local_438[0]);
                    }
                    puVar11 = local_648.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    if (bVar24) {
                      uVar19 = (long)local_648.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_648.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      if (uVar19 != 0) {
                        uVar16 = 0;
                        uVar22 = 0;
                        do {
                          local_530.super_full_box.super_box.size_ = 0;
                          local_530.super_full_box.super_box.large_size_ = 0;
                          local_530.super_full_box.super_box.box_type_._M_dataplus._M_p =
                               (pointer)&local_530.super_full_box.super_box.box_type_.field_2;
                          local_530.super_full_box.super_box.box_type_._M_string_length = 0;
                          local_530.super_full_box.super_box.box_type_.field_2._M_local_buf[0] =
                               '\0';
                          local_530.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
                          local_530.super_full_box.super_box._90_8_ = 0;
                          local_530.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_530.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._0_2_ = 0;
                          local_530.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._2_6_ = 0;
                          local_530.super_full_box.super_box._98_1_ = 0;
                          local_530.super_full_box.super_box._100_4_ = 0;
                          local_530.super_full_box.magic_conf_ = 0;
                          local_530.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_00128310;
                          local_530.id_ = 0;
                          local_530._108_8_ = 0;
                          local_530._116_8_ = 0;
                          local_530.scheme_id_uri_._M_string_length = 0;
                          local_530.scheme_id_uri_.field_2._M_local_buf[0] = '\0';
                          local_530.value_._M_string_length = 0;
                          local_530.value_.field_2._M_local_buf[0] = '\0';
                          (local_620->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          (local_620->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start = (pointer)0x0;
                          (local_620->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_530.scheme_id_uri_._M_dataplus._M_p = (pointer)paVar21;
                          local_530.value_._M_dataplus._M_p = (pointer)paVar18;
                          uVar13 = EventMessageInstanceBox::parse
                                             ((EventMessageInstanceBox *)&local_530,
                                              (char *)(local_648.
                                                                                                              
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar16
                                                  ),(uint)uVar19,local_660);
                          EventMessageInstanceBox::print((EventMessageInstanceBox *)&local_530);
                          local_530.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_00128310;
                          if (local_530.message_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_530.message_data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          }
                          ppuVar23 = local_628;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_530.value_._M_dataplus._M_p != paVar18) {
                            operator_delete(local_530.value_._M_dataplus._M_p);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_530.scheme_id_uri_._M_dataplus._M_p != paVar21) {
                            operator_delete(local_530.scheme_id_uri_._M_dataplus._M_p);
                          }
                          local_530.super_full_box.super_box._vptr_box = (_func_int **)ppuVar23;
                          if (local_530.super_full_box.super_box.box_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_530.super_full_box.super_box.box_data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_530.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                              &local_530.super_full_box.super_box.box_type_.field_2) {
                            operator_delete(local_530.super_full_box.super_box.box_type_._M_dataplus
                                            ._M_p);
                          }
                          uVar22 = uVar22 + uVar13;
                          uVar16 = (ulong)uVar22;
                          uVar19 = (long)local_648.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_648.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                        } while (uVar16 < uVar19);
                      }
                    }
                    else {
                      local_458[0] = local_448;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"emsg","")
                      ;
                      if (((puVar11[4] != *local_458[0]) || (puVar11[5] != local_458[0][1])) ||
                         ((puVar11[6] != local_458[0][2] ||
                          (bVar24 = true, puVar11[7] != local_458[0][3])))) {
                        bVar24 = false;
                      }
                      if (local_458[0] != local_448) {
                        operator_delete(local_458[0]);
                      }
                      if ((bVar24) &&
                         (uVar19 = (long)local_648.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_648.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start, uVar19 != 0)) {
                        uVar16 = 0;
                        uVar22 = 0;
                        do {
                          local_530.super_full_box.super_box.size_ = 0;
                          local_530.super_full_box.super_box.large_size_ = 0;
                          local_530.super_full_box.super_box.box_type_._M_dataplus._M_p =
                               (pointer)&local_530.super_full_box.super_box.box_type_.field_2;
                          local_530.super_full_box.super_box.box_type_._M_string_length = 0;
                          local_530.super_full_box.super_box.box_type_.field_2._M_local_buf[0] =
                               '\0';
                          local_530.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
                          local_530.super_full_box.super_box._90_8_ = 0;
                          local_530.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_530.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._0_2_ = 0;
                          local_530.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._2_6_ = 0;
                          local_530.super_full_box.super_box._98_1_ = 0;
                          local_530.super_full_box.super_box._100_4_ = 0;
                          local_530.super_full_box.magic_conf_ = 0;
                          local_530.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_001282c8;
                          local_530.scheme_id_uri_._M_string_length = 0;
                          local_530.scheme_id_uri_.field_2._M_local_buf[0] = '\0';
                          local_530.value_._M_string_length = 0;
                          local_530.value_.field_2._M_local_buf[0] = '\0';
                          (local_620->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          (local_620->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start = (pointer)0x0;
                          (local_620->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_530.scheme_id_uri_._M_dataplus._M_p = (pointer)paVar21;
                          local_530.value_._M_dataplus._M_p = (pointer)paVar18;
                          uVar13 = DASHEventMessageBoxv1::parse
                                             (&local_530,
                                              (char *)(local_648.
                                                                                                              
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar16
                                                  ),(uint)uVar19,local_660);
                          DASHEventMessageBoxv1::print(&local_530);
                          local_530.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_001282c8;
                          if (local_530.message_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_530.message_data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          }
                          ppuVar23 = local_628;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_530.value_._M_dataplus._M_p != paVar18) {
                            operator_delete(local_530.value_._M_dataplus._M_p);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_530.scheme_id_uri_._M_dataplus._M_p != paVar21) {
                            operator_delete(local_530.scheme_id_uri_._M_dataplus._M_p);
                          }
                          local_530.super_full_box.super_box._vptr_box = (_func_int **)ppuVar23;
                          if (local_530.super_full_box.super_box.box_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_530.super_full_box.super_box.box_data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_530.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                              &local_530.super_full_box.super_box.box_type_.field_2) {
                            operator_delete(local_530.super_full_box.super_box.box_type_._M_dataplus
                                            ._M_p);
                          }
                          uVar22 = uVar22 + uVar13;
                          uVar16 = (ulong)uVar22;
                          uVar19 = (long)local_648.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_648.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                        } while (uVar16 < uVar19);
                      }
                    }
                  }
                  uVar22 = *(uint *)((long)&(local_c8.m_sentry.
                                             super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            sample_duration_ + local_5f8);
                  if (local_648.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_648.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  local_630 = (ulong)(uVar6 + (int)local_630);
                  local_660 = local_660 + uVar22;
                  uVar19 = local_5f0 + 1;
                } while (uVar19 < (ulong)((long)local_c8.m_sentry.
                                                super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_c8.m_sentry.
                                                super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following"
                       ,0x68);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
            std::ostream::put(-0x30);
            std::ostream::flush();
          }
          pbVar20 = pbVar20 + 1;
          fmp4_stream::media_fragment::~media_fragment((media_fragment *)local_418);
        }
        psVar1 = &pbVar20->box_type_;
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar9 = *(undefined4 *)&pbVar20->field_0xc;
          uVar7 = pbVar20->large_size_;
          local_590[0] = pbVar20->size_;
          local_590[1] = uVar9;
          *(uint64_t *)(local_590 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_598);
          uVar8 = *(undefined8 *)(pbVar20->extended_type_ + 8);
          *(undefined8 *)local_5b0 = *(undefined8 *)pbVar20->extended_type_;
          *(undefined8 *)(local_5b0 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_5b8,&pbVar20->box_data_);
          bVar24 = pbVar20->has_uuid_;
          (this->super_ingest_stream).mfra_box_.is_large_ = pbVar20->is_large_;
          (this->super_ingest_stream).mfra_box_.has_uuid_ = bVar24;
        }
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar9 = *(undefined4 *)&pbVar20->field_0xc;
          uVar7 = pbVar20->large_size_;
          local_5a0[0] = pbVar20->size_;
          local_5a0[1] = uVar9;
          *(uint64_t *)(local_5a0 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_5a8);
          uVar8 = *(undefined8 *)(pbVar20->extended_type_ + 8);
          *(undefined8 *)local_5c0 = *(undefined8 *)pbVar20->extended_type_;
          *(undefined8 *)(local_5c0 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_5c8,&pbVar20->box_data_);
          bVar24 = pbVar20->has_uuid_;
          (this->super_ingest_stream).sidx_box_.is_large_ = pbVar20->is_large_;
          (this->super_ingest_stream).sidx_box_.has_uuid_ = bVar24;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|sidx|",6);
        }
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar9 = *(undefined4 *)&pbVar20->field_0xc;
          uVar7 = pbVar20->large_size_;
          local_5d0[0] = pbVar20->size_;
          local_5d0[1] = uVar9;
          *(uint64_t *)(local_5d0 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_5d8);
          uVar8 = *(undefined8 *)(pbVar20->extended_type_ + 8);
          *(undefined8 *)local_5e0 = *(undefined8 *)pbVar20->extended_type_;
          *(undefined8 *)(local_5e0 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_5e8,&pbVar20->box_data_);
          bVar24 = pbVar20->has_uuid_;
          (this->super_ingest_stream).meta_box_.is_large_ = pbVar20->is_large_;
          (this->super_ingest_stream).meta_box_.has_uuid_ = bVar24;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|meta|",6);
        }
        pbVar20 = pbVar20 + 1;
        bVar24 = pbVar20 ==
                 local_618.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      } while (!bVar24);
    }
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_618);
  }
LAB_0010c412:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return 0;
}

Assistant:

int event_track::ingest_event_stream::print_samples_from_file(std::istream &infile, bool init_only)
{
	try
	{
		if (infile)
		{
			std::vector<box> ingest_boxes;

			while (infile.good()) // read box by box in a vector
			{
				box b = {};

				if (b.read(infile))
					ingest_boxes.push_back(b);
				else  // break when we have boxes of size zero
					break;

				if (b.box_type_.compare("mfra") == 0)
					break;
			}

			// organize the boxes in init fragments and media fragments 
			for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
			{
				if (it->box_type_.compare("ftyp") == 0)
				{
					//cout << "|ftyp|";
					init_fragment_.ftyp_box_ = *it;
				}
				if (it->box_type_.compare("moov") == 0)
				{
					//cout << "|moov|";
					init_fragment_.moov_box_ = *it;

					if (init_only)
						return 0;
				}

				if (it->box_type_.compare("moof") == 0) // in case of moof box we push both the moof and following mdat
				{
					media_fragment m = {};
					m.moof_box_ = *it;
					m.parse_moof();
					bool mdat_found = false;
					std::cout << "==  found movie fragment with base media decode time: " << m.tfdt_.base_media_decode_time_ << std::endl;
					it++;

					// only support default base is moof and mdat immediately following (CMAF)
					if (m.tfhd_.default_base_is_moof_ && (m.trun_.data_offset_ - 8) == m.moof_box_.size_) {

						if (it->box_type_.compare("mdat") == 0)
						{
							m.mdat_box_ = *it;
							uint64_t pres_time = m.tfdt_.base_media_decode_time_;
							uint32_t data_offset = 0;

							if (m.trun_.sample_duration_present_ && m.trun_.sample_size_present_)
							{
								for (int i = 0; i < m.trun_.m_sentry.size(); i++)
								{
									uint32_t ss = m.trun_.m_sentry[i].sample_size_;
									std::vector<uint8_t> sample_data(ss);
									std::cout << "== found sample, presentation time = " << pres_time <<
										" duration = " \
										<< m.trun_.m_sentry[i].sample_duration_ << " sample size = " << m.trun_.m_sentry[i].sample_size_ << " == " << std::endl;
									for (unsigned int j = 0; j < ss; j++)
										sample_data[j] = m.mdat_box_.box_data_[8 + data_offset + j];

									//parse_event_sample(sample_data,uint64_t presentation_time, )
									unsigned int bts = 0;
									if (ss > 8)
									{
										if (compare_4cc((char *) &sample_data[4], "emib")) {
											while (bts < sample_data.size()) {
												EventMessageInstanceBox im_box;
												bts += im_box.parse((char *)sample_data.data() + bts, (unsigned int)sample_data.size(),pres_time);
												im_box.print();
											}
										}
										else if (compare_4cc((char *)&sample_data[4], "emsg"))
										{
											while (bts < sample_data.size()) 
											{
												DASHEventMessageBoxv1 e;
												bts += e.parse((char *)sample_data.data() + bts, (unsigned int) sample_data.size(),pres_time);
												e.print();
											}
										}
									}
									else
									{
										std::cout << "empty sample (embe/emeb): " << std::endl;
									}

									data_offset += ss;
									pres_time += m.trun_.m_sentry[i].sample_duration_;
								}
							}
						}
					}
					else
					{
						std::cout << "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following" << std::endl;
					}
				}
				if (it->box_type_.compare("mfra") == 0)
				{
					this->mfra_box_ = *it;
				}
				if (it->box_type_.compare("sidx") == 0)
				{
					this->sidx_box_ = *it;
					std::cout << "|sidx|";
				}
				if (it->box_type_.compare("meta") == 0)
				{
					this->meta_box_ = *it;
					std::cout << "|meta|";
				}
			}
		}
		std::cout << std::endl;
		std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;

		return 0;
	}
	catch (std::exception e)
	{
		std::cout << e.what() << std::endl;
		return 0;
	}
}